

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall
PrintfTest_VSPrintfMakeWArgsExample_Test::~PrintfTest_VSPrintfMakeWArgsExample_Test
          (PrintfTest_VSPrintfMakeWArgsExample_Test *this)

{
  void *in_RDI;
  
  ~PrintfTest_VSPrintfMakeWArgsExample_Test((PrintfTest_VSPrintfMakeWArgsExample_Test *)0x140ea8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(PrintfTest, VSPrintfMakeWArgsExample) {
  fmt::format_arg_store<fmt::wprintf_context, int, const wchar_t *> as{
     42, L"something"};
  fmt::basic_format_args<fmt::wprintf_context> args(as);
  EXPECT_EQ(
     L"[42] something happened",
     fmt::vsprintf(L"[%d] %s happened", args));
  auto  as2 = fmt::make_wprintf_args(42, L"something");
  fmt::basic_format_args<fmt::wprintf_context> args2(as2);
  EXPECT_EQ(
      L"[42] something happened", fmt::vsprintf(L"[%d] %s happened", args2));
  // the older gcc versions can't cast the return value
#if !defined(__GNUC__) || (__GNUC__ > 4)
  EXPECT_EQ(
      L"[42] something happened",
      fmt::vsprintf(
          L"[%d] %s happened", fmt::make_wprintf_args(42, L"something")));
#endif
}